

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

void Aig_ConeMark_rec(Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDfs.c"
                  ,0x26f,"void Aig_ConeMark_rec(Aig_Obj_t *)");
  }
  iVar1 = Aig_ObjIsNode(pObj);
  if ((iVar1 != 0) && (iVar1 = Aig_ObjIsMarkA(pObj), iVar1 == 0)) {
    pAVar2 = Aig_ObjFanin0(pObj);
    Aig_ConeMark_rec(pAVar2);
    pAVar2 = Aig_ObjFanin1(pObj);
    Aig_ConeMark_rec(pAVar2);
    iVar1 = Aig_ObjIsMarkA(pObj);
    if (iVar1 != 0) {
      __assert_fail("!Aig_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDfs.c"
                    ,0x274,"void Aig_ConeMark_rec(Aig_Obj_t *)");
    }
    Aig_ObjSetMarkA(pObj);
  }
  return;
}

Assistant:

void Aig_ConeMark_rec( Aig_Obj_t * pObj )
{
    assert( !Aig_IsComplement(pObj) );
    if ( !Aig_ObjIsNode(pObj) || Aig_ObjIsMarkA(pObj) )
        return;
    Aig_ConeMark_rec( Aig_ObjFanin0(pObj) );
    Aig_ConeMark_rec( Aig_ObjFanin1(pObj) );
    assert( !Aig_ObjIsMarkA(pObj) ); // loop detection
    Aig_ObjSetMarkA( pObj );
}